

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

void __thiscall
Kernel::LiteralComparators::NoPositiveEquality::NoPositiveEquality
          (NoPositiveEquality *this,NoPositiveEquality *param_2)

{
  LiteralComparator *in_RSI;
  LiteralComparator *in_RDI;
  
  LiteralComparator::LiteralComparator(in_RDI,in_RSI);
  in_RDI->_vptr_LiteralComparator = (_func_int **)&PTR__NoPositiveEquality_0131f0f8;
  return;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    bool l1PE=l1->isEquality()&&l1->isPositive();
    bool l2PE=l2->isEquality()&&l2->isPositive();
    if( l1PE && !l2PE ) {
      return LESS;
    } else if( !l1PE && l2PE ) {
      return GREATER;
    } else {
      return EQUAL;
    }
  }